

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O2

DescriptorPoolWrapper * __thiscall
Diligent::DescriptorPoolManager::GetPool
          (DescriptorPoolWrapper *__return_storage_ptr__,DescriptorPoolManager *this,char *DebugName
          )

{
  VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14> *rhs;
  element_type *peVar1;
  DescriptorPoolWrapper *Pool;
  
  std::mutex::lock(&this->m_Mutex);
  LOCK();
  (this->m_AllocatedPoolCounter).super___atomic_base<int>._M_i =
       (this->m_AllocatedPoolCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  rhs = (this->m_Pools).
        super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->m_Pools).
      super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur == rhs) {
    CreateDescriptorPool(__return_storage_ptr__,this,DebugName);
  }
  else {
    peVar1 = (this->m_DeviceVkImpl->m_LogicalVkDevice).
             super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    VulkanUtilities::
    VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>::
    VulkanObjectWrapper(__return_storage_ptr__,rhs);
    VulkanUtilities::SetDescriptorPoolName
              (peVar1->m_VkDevice,__return_storage_ptr__->m_VkObject,DebugName);
    std::
    deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
    ::pop_front(&this->m_Pools);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return __return_storage_ptr__;
}

Assistant:

VulkanUtilities::DescriptorPoolWrapper DescriptorPoolManager::GetPool(const char* DebugName)
{
    std::lock_guard<std::mutex> Lock{m_Mutex};
#ifdef DILIGENT_DEVELOPMENT
    ++m_AllocatedPoolCounter;
#endif
    if (m_Pools.empty())
        return CreateDescriptorPool(DebugName);
    else
    {
        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_DeviceVkImpl.GetLogicalDevice();
        VulkanUtilities::DescriptorPoolWrapper      Pool          = std::move(m_Pools.front());
        VulkanUtilities::SetDescriptorPoolName(LogicalDevice.GetVkDevice(), Pool, DebugName);
        m_Pools.pop_front();
        return Pool;
    }
}